

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.h
# Opt level: O3

void __thiscall wallet::CKeyPool::Unserialize<DataStream>(CKeyPool *this,DataStream *s)

{
  size_t in_RCX;
  long in_FS_OFFSET;
  uint32_t obj;
  uint8_t obj_2;
  char local_30;
  undefined7 uStack_2f;
  char local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::read(s,(int)&local_30,(void *)0x4,in_RCX);
  DataStream::read(s,(int)&local_30,&DAT_00000008,in_RCX);
  this->nTime = CONCAT71(uStack_2f,local_30);
  CPubKey::Unserialize<DataStream>(&this->vchPubKey,s);
  DataStream::read(s,(int)&local_21,(void *)0x1,in_RCX);
  this->fInternal = local_21 != '\0';
  DataStream::read(s,(int)&local_30,(void *)0x1,in_RCX);
  this->m_pre_split = local_30 != '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> int{}; // Discard unused field
        s >> nTime >> vchPubKey;
        try {
            s >> fInternal;
        } catch (std::ios_base::failure&) {
            /* flag as external address if we can't read the internal boolean
               (this will be the case for any wallet before the HD chain split version) */
            fInternal = false;
        }
        try {
            s >> m_pre_split;
        } catch (std::ios_base::failure&) {
            /* flag as postsplit address if we can't read the m_pre_split boolean
               (this will be the case for any wallet that upgrades to HD chain split) */
            m_pre_split = false;
        }
    }